

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi.cpp
# Opt level: O2

void __thiscall Spi::error(Spi *this,int status)

{
  ostream *poVar1;
  
  check_rx(this);
  poVar1 = std::operator<<((ostream *)&std::cerr,"ABORT.");
  std::endl<char,std::char_traits<char>>(poVar1);
  if (this->active == true) {
    disconnect(this);
  }
  exit(status);
}

Assistant:

void Spi::error(int status) {
	check_rx();
	cerr << "ABORT." << endl;
	if (active)
		disconnect();
	exit(status);
}